

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

void bcread_fill(LexState *ls,MSize len,int need)

{
  SBuf *sb;
  MSize sz_00;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  size_t sz;
  ulong local_38;
  
  if ((len < 0x7fffff01) && (-1 < ls->c)) {
    sb = &ls->sb;
    do {
      pcVar1 = (ls->sb).b;
      pcVar5 = ls->p;
      uVar4 = (long)ls->pe - (long)pcVar5;
      iVar3 = (int)uVar4;
      if (iVar3 != 0) {
        if (*(int *)&sb->w == (int)pcVar1) {
          pcVar1 = (ls->sb).b;
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar1) < len) {
            pcVar1 = lj_buf_need2(sb,len);
          }
          memcpy(pcVar1,ls->p,uVar4 & 0xffffffff);
        }
        else if (pcVar5 != pcVar1) {
          memmove(pcVar1,pcVar5,uVar4 & 0xffffffff);
        }
        ls->p = pcVar1;
        ls->pe = pcVar1 + (uVar4 & 0xffffffff);
      }
      (ls->sb).w = pcVar1 + (uVar4 & 0xffffffff);
      pcVar1 = (*ls->rfunc)(ls->L,ls->rdata,&local_38);
      bVar7 = local_38 == 0;
      if (bVar7 || pcVar1 == (char *)0x0) {
        if (need != 0) break;
        ls->c = -1;
      }
      else {
        if (0x7fffff00 - iVar3 <= local_38) {
          lj_err_mem(ls->L);
        }
        if (iVar3 == 0) {
          ls->p = pcVar1;
          pcVar5 = pcVar1 + local_38;
        }
        else {
          uVar6 = (int)local_38 + iVar3;
          sz_00 = len;
          if (len < uVar6) {
            sz_00 = uVar6;
          }
          pcVar2 = (ls->sb).b;
          if ((uint)(*(int *)&(ls->sb).e - (int)pcVar2) < sz_00) {
            pcVar2 = lj_buf_need2(sb,sz_00);
          }
          memcpy((ls->sb).w,pcVar1,local_38);
          pcVar5 = pcVar2 + uVar6;
          (ls->sb).w = pcVar5;
          ls->p = pcVar2;
        }
        ls->pe = pcVar5;
      }
      if ((bVar7 || pcVar1 == (char *)0x0) || (len <= (uint)(*(int *)&ls->pe - *(int *)&ls->p))) {
        return;
      }
    } while( true );
  }
  bcread_error(ls,LJ_ERR_BCBAD);
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = ls->sb.b;
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == ls->sb.w, "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    ls->sb.w = p + n;
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(ls->sb.w, buf, sz);
      ls->sb.w = p + n;
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}